

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  BtCursor *pCur;
  Mem *pMem;
  long lVar1;
  u8 uVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  ulong uVar6;
  u32 iSerial;
  int dummy;
  u32 local_6c;
  MemValue local_68;
  long lStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  *ppOut = (sqlite3_value *)0x0;
  if (pVal == (sqlite3_value *)0x0) {
    return 0x15;
  }
  iVar3 = 0x1e5e6d;
  puVar5 = (undefined8 *)sqlite3_value_pointer(pVal,"ValueList");
  if (puVar5 == (undefined8 *)0x0) {
    return 0x15;
  }
  if (bNext == 0) {
    local_68.i = (ulong)(uint)local_68.i._4_4_ << 0x20;
    iVar4 = sqlite3BtreeFirst((BtCursor *)*puVar5,&local_68.nZero);
    iVar3 = 0x65;
    if (*(char *)*puVar5 == '\0') {
      iVar3 = iVar4;
    }
  }
  else {
    iVar3 = sqlite3BtreeNext((BtCursor *)*puVar5,iVar3);
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68.r = 0.0;
  lStack_60 = 0;
  local_38 = 0;
  pCur = (BtCursor *)*puVar5;
  getCellInfo(pCur);
  iVar3 = sqlite3VdbeMemFromBtreeZeroOffset
                    ((BtCursor *)*puVar5,(pCur->info).nPayload,(Mem *)&local_68);
  lVar1 = lStack_60;
  if (iVar3 == 0) {
    pMem = (Mem *)puVar5[1];
    if (*(char *)(lStack_60 + 1) < '\0') {
      uVar2 = sqlite3GetVarint32((uchar *)(lStack_60 + 1),&local_6c);
      uVar6 = (ulong)(byte)(uVar2 + 1);
    }
    else {
      uVar6 = 2;
      local_6c = (int)*(char *)(lStack_60 + 1);
    }
    sqlite3VdbeSerialGet((uchar *)(lVar1 + uVar6),local_6c,pMem);
    pMem->enc = pMem->db->enc;
    if ((pMem->flags & 0x4000) != 0) {
      iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
      iVar3 = 7;
      if (iVar4 != 0) goto LAB_0013a59a;
    }
    *ppOut = pMem;
    iVar3 = 0;
  }
LAB_0013a59a:
  if (((local_58 & 0x900000000000) != 0) || ((int)local_48 != 0)) {
    vdbeMemClear((Mem *)&local_68);
  }
  return iVar3;
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE;
  pRhs = (ValueList*)sqlite3_value_pointer(pVal, "ValueList");
  if( pRhs==0 ) return SQLITE_MISUSE;
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}